

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt32 * tt_cmap14_get_def_chars(TT_CMap cmap,FT_Byte *p,FT_Memory memory)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  FT_UInt FVar9;
  FT_Error FVar10;
  FT_CMap_Class pFVar11;
  FT_CMap_Class pFVar12;
  FT_UInt32 FVar13;
  int iVar14;
  uint local_34;
  
  FVar9 = tt_cmap14_def_char_count(p);
  bVar5 = *p;
  bVar6 = p[1];
  bVar7 = p[2];
  bVar8 = p[3];
  FVar10 = tt_cmap14_ensure((TT_CMap14)cmap,FVar9 + 1,memory);
  if (FVar10 == 0) {
    local_34 = (uint)bVar8;
    pFVar11 = cmap[1].cmap.clazz;
    pFVar12 = pFVar11;
    for (local_34 = (uint)bVar7 << 8 | (uint)bVar6 << 0x10 | (uint)bVar5 << 0x18 | local_34;
        local_34 != 0; local_34 = local_34 - 1) {
      pbVar1 = p + 4;
      pbVar2 = p + 5;
      pbVar3 = p + 6;
      pbVar4 = p + 7;
      p = p + 4;
      FVar13 = (uint)*pbVar3 | (uint)*pbVar2 << 8 | (uint)*pbVar1 << 0x10;
      iVar14 = *pbVar4 + 1;
      do {
        *(FT_UInt32 *)&pFVar12->size = FVar13;
        FVar13 = FVar13 + 1;
        pFVar12 = (FT_CMap_Class)((long)&pFVar12->size + 4);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    *(FT_UInt32 *)&pFVar12->size = 0;
  }
  else {
    pFVar11 = (FT_CMap_Class)0x0;
  }
  return (FT_UInt32 *)pFVar11;
}

Assistant:

static FT_UInt32*
  tt_cmap14_get_def_chars( TT_CMap    cmap,
                           FT_Byte*   p,
                           FT_Memory  memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14) cmap;
    FT_UInt32   numRanges;
    FT_UInt     cnt;
    FT_UInt32*  q;


    cnt       = tt_cmap14_def_char_count( p );
    numRanges = (FT_UInt32)TT_NEXT_ULONG( p );

    if ( tt_cmap14_ensure( cmap14, ( cnt + 1 ), memory ) )
      return NULL;

    for ( q = cmap14->results; numRanges > 0; numRanges-- )
    {
      FT_UInt32  uni = (FT_UInt32)TT_NEXT_UINT24( p );


      cnt = FT_NEXT_BYTE( p ) + 1;
      do
      {
        q[0]  = uni;
        uni  += 1;
        q    += 1;

      } while ( --cnt != 0 );
    }
    q[0] = 0;

    return cmap14->results;
  }